

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_MultiSubFallthrough_Test::TestBody(TApp_MultiSubFallthrough_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  App *pAVar2;
  char *pcVar3;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_640;
  AssertHelper local_5d0;
  Message local_5c8 [2];
  OptionNotFound *anon_var_0_1;
  string local_5b0;
  byte local_589;
  char *pcStack_588;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_518;
  Message local_510;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_4d0;
  Message local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_490;
  Message local_488;
  allocator local_479;
  string local_478;
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_420;
  Message local_418;
  allocator local_409;
  string local_408;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  iterator local_3a0;
  size_type local_398;
  AssertHelper local_390;
  Message local_388 [2];
  ExtrasError *anon_var_0;
  char *pcStack_370;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_348;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2c0;
  Message local_2b8;
  allocator local_2a9;
  string local_2a8;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1c8;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_180;
  Message local_178;
  allocator local_169;
  string local_168;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  iterator local_e0;
  size_type local_d8;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  App *local_80;
  App *sub2;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *sub1;
  TApp_MultiSubFallthrough_Test *this_local;
  
  sub1 = (App *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"sub1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&sub2 + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"sub2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  gtest_ar_.message_.ptr_._5_1_ = 1;
  local_80 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"sub1",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"sub2",(allocator *)((long)&gtest_ar_.message_.ptr_ + 6));
  gtest_ar_.message_.ptr_._5_1_ = 0;
  local_e0 = &local_120;
  local_d8 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_640 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_640 = local_640 + -1;
    std::__cxx11::string::~string((string *)local_640);
  } while (local_640 != &local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"sub1",&local_169);
  local_141 = CLI::App::got_subcommand(&(this->super_TApp).app,&local_168);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_140,
               (AssertionResult *)"app.got_subcommand(\"sub1\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_1b1 = CLI::App::got_subcommand(&(this->super_TApp).app,local_18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1b0,
               (AssertionResult *)"app.got_subcommand(sub1)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  testing::AssertionResult::AssertionResult<CLI::App>
            ((AssertionResult *)local_1f8,local_18,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1f8,(AssertionResult *)"*sub1",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_239 = CLI::App::parsed(local_18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_238,
               (AssertionResult *)"sub1->parsed()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"sub2",&local_2a9);
  local_281 = CLI::App::got_subcommand(&(this->super_TApp).app,&local_2a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_280,
               (AssertionResult *)"app.got_subcommand(\"sub2\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2f1 = CLI::App::got_subcommand(&(this->super_TApp).app,local_80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_2f0,
               (AssertionResult *)"app.got_subcommand(sub2)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  testing::AssertionResult::AssertionResult<CLI::App>
            ((AssertionResult *)local_338,local_80,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg,(internal *)local_338,(AssertionResult *)"*sub2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_msg);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  CLI::App::reset(&(this->super_TApp).app);
  CLI::App::require_subcommand(&(this->super_TApp).app);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  CLI::App::require_subcommand(&(this->super_TApp).app,2);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  CLI::App::require_subcommand(&(this->super_TApp).app,1);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc90,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc90);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00115e8c;
    pcStack_370 = 
    "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_388);
  testing::internal::AssertHelper::AssertHelper
            (&local_390,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x58,pcStack_370);
  testing::internal::AssertHelper::operator=(&local_390,local_388);
  testing::internal::AssertHelper::~AssertHelper(&local_390);
  testing::Message::~Message(local_388);
LAB_00115e8c:
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar__7.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,"sub1",(allocator *)((long)&gtest_ar__7.message_.ptr_ + 7));
  gtest_ar__7.message_.ptr_._6_1_ = 0;
  local_3a0 = &local_3c0;
  local_398 = 1;
  __l._M_len = 1;
  __l._M_array = local_3a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_710 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a0;
  do {
    local_710 = local_710 + -1;
    std::__cxx11::string::~string((string *)local_710);
  } while (local_710 != &local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__7.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"sub1",&local_409);
  local_3e1 = CLI::App::got_subcommand(&(this->super_TApp).app,&local_408);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_3e0,
               (AssertionResult *)"app.got_subcommand(\"sub1\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"sub2",&local_479);
  bVar1 = CLI::App::got_subcommand(&(this->super_TApp).app,&local_478);
  local_451 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_450,&local_451,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_450,
               (AssertionResult *)"app.got_subcommand(\"sub2\")","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  testing::AssertionResult::AssertionResult<CLI::App>
            ((AssertionResult *)local_4c0,local_18,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_4c0,(AssertionResult *)"*sub1",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_501 = CLI::App::operator_cast_to_bool(local_80);
  local_501 = !local_501;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_500,(AssertionResult *)"*sub2",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  local_549 = CLI::App::parsed(local_80);
  local_549 = !local_549;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,&local_549,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg_1,(internal *)local_548,(AssertionResult *)"sub2->parsed()",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    std::__cxx11::string::~string((string *)&gtest_msg_1);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffa78,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffa78);
  if (bVar1) {
    local_589 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5b0,"sub3",(allocator *)((long)&anon_var_0_1 + 7));
      CLI::App::got_subcommand(&(this->super_TApp).app,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
    }
    if ((local_589 & 1) != 0) {
      return;
    }
    pcStack_588 = 
    "Expected: app.got_subcommand(\"sub3\") throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_5c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_5d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x65,pcStack_588);
  testing::internal::AssertHelper::operator=(&local_5d0,local_5c8);
  testing::internal::AssertHelper::~AssertHelper(&local_5d0);
  testing::Message::~Message(local_5c8);
  return;
}

Assistant:

TEST_F(TApp, MultiSubFallthrough) {

    // No explicit fallthrough
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    args = {"sub1", "sub2"};
    run();
    EXPECT_TRUE(app.got_subcommand("sub1"));
    EXPECT_TRUE(app.got_subcommand(sub1));
    EXPECT_TRUE(*sub1);
    EXPECT_TRUE(sub1->parsed());

    EXPECT_TRUE(app.got_subcommand("sub2"));
    EXPECT_TRUE(app.got_subcommand(sub2));
    EXPECT_TRUE(*sub2);

    app.reset();
    app.require_subcommand();

    run();

    app.reset();
    app.require_subcommand(2);

    run();

    app.reset();
    app.require_subcommand(1);

    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"sub1"};
    run();

    EXPECT_TRUE(app.got_subcommand("sub1"));
    EXPECT_FALSE(app.got_subcommand("sub2"));

    EXPECT_TRUE(*sub1);
    EXPECT_FALSE(*sub2);
    EXPECT_FALSE(sub2->parsed());

    EXPECT_THROW(app.got_subcommand("sub3"), CLI::OptionNotFound);
}